

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  SVQueue *pSVar1;
  _Map_pointer ppCVar2;
  ConstantRange CVar3;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_00;
  bool bVar4;
  ER EVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  ER EVar9;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar10;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  _Base_ptr p_Var12;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar13;
  reference cv_00;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar14;
  ulong uVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar16;
  int iVar17;
  pointer pLVar18;
  EvalContext *pEVar19;
  pointer extraout_RDX;
  pointer pCVar20;
  __extent_storage<18446744073709551615UL> _Var21;
  ER unaff_R13D;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar22;
  ER EVar23;
  _Rb_tree_header *p_Var24;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_01;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_02;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_03;
  undefined1 local_f9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  undefined2 local_ec;
  __extent_storage<18446744073709551615UL> local_e8;
  pointer local_e0;
  ForeachLoopStatement *local_d8;
  EvalContext *local_d0;
  ConstantValue *local_c8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_c0;
  undefined1 local_a0;
  __extent_storage<18446744073709551615UL> local_98;
  ConstantValue *local_90;
  long local_88;
  void *local_80;
  pointer local_78;
  pointer local_70;
  __extent_storage<18446744073709551615UL> local_68;
  long local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  _Var21 = currDims._M_extent._M_extent_value;
  pLVar18 = currDims._M_ptr;
  if (pLVar18->loopVar == (IteratorSymbol *)0x0) {
    local_a0 = 0;
    currDims_01._M_extent._M_extent_value = _Var21._M_extent_value - 1;
    currDims_01._M_ptr = pLVar18 + 1;
    EVar9 = evalRecursive(this,context,(ConstantValue *)&local_c0,currDims_01);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_c0);
    return EVar9;
  }
  local_58._M_index = '\0';
  local_90 = EvalContext::createLocal
                       (context,(ValueSymbol *)pLVar18->loopVar,(ConstantValue *)&local_58);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  local_e0 = pLVar18;
  local_d8 = this;
  local_d0 = context;
  switch(*(__index_type *)
          ((long)&(cv->value).
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          + 0x20)) {
  case '\x05':
    pvVar10 = std::
              get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    pCVar20 = (pvVar10->
              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_88 = ((long)(pvVar10->
                      super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 3) *
               -0x3333333333333333;
    local_78 = pCVar20;
    break;
  case '\x06':
    pvVar14 = std::
              get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    if (pvVar14->_M_string_length == 0) {
      return Success;
    }
    aVar22.val = 0;
    while( true ) {
      local_f0 = 0x20;
      local_ec = 1;
      local_f8 = aVar22;
      SVInt::clearUnusedBits((SVInt *)&local_f8);
      local_c0._0_8_ = local_f8;
      local_c0._8_4_ = local_f0;
      local_c0._12_1_ = (undefined1)local_ec;
      local_c0._13_1_ = local_ec._1_1_;
      if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
        local_f8.val = 0;
      }
      local_a0 = 1;
      local_c8 = local_90;
      std::operator=(&local_c8,&local_c0,&local_f9);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0);
      if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) && ((void *)local_f8.val != (void *)0x0))
      {
        operator_delete__(local_f8.pVal);
      }
      EVar5 = Statement::eval(local_d8->body,local_d0);
      if ((EVar5 == Continue) || (pEVar19 = (EvalContext *)(ulong)EVar5, EVar5 == Success)) {
        pEVar19 = (EvalContext *)((ulong)context & 0xffffffff);
      }
      if ((EVar5 != Continue) && (EVar5 != Success)) break;
      aVar22.pVal = (uint64_t *)(aVar22.val + 1);
      context = pEVar19;
      if ((void *)pvVar14->_M_string_length <= (ulong)aVar22) {
        return Success;
      }
    }
    return (ER)pEVar19;
  case '\a':
    pvVar11 = std::
              get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    p_Var12 = (pvVar11->ptr->
              super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(pvVar11->ptr->
               super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               )._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 == p_Var24) {
      return Success;
    }
    local_e8._M_extent_value = _Var21._M_extent_value - 1;
    local_e0 = local_e0 + 1;
    while( true ) {
      local_c0._0_8_ = local_90;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
        ::_S_vtable._M_arr[(long)(char)p_Var12[2]._M_color + 1]._M_data)
                ((anon_class_8_1_8991fb9c_conflict *)&local_c0,
                 (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  *)(p_Var12 + 1));
      if (_Var21._M_extent_value < 2) {
        EVar9 = Statement::eval(local_d8->body,context);
      }
      else {
        currDims_02._M_extent._M_extent_value = local_e8._M_extent_value;
        currDims_02._M_ptr = local_e0;
        EVar9 = evalRecursive(local_d8,context,(ConstantValue *)&p_Var12[2]._M_parent,currDims_02);
      }
      if ((EVar9 == Continue) || (EVar23 = EVar9, EVar9 == Success)) {
        EVar23 = unaff_R13D;
      }
      if ((EVar9 != Continue) && (EVar9 != Success)) break;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      context = local_d0;
      unaff_R13D = EVar23;
      if ((_Rb_tree_header *)p_Var12 == p_Var24) {
        return Success;
      }
    }
    return EVar23;
  case '\b':
    pvVar13 = std::
              get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    pSVar1 = pvVar13->ptr;
    local_e8._M_extent_value =
         (size_t)&(pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_start;
    local_98._M_extent_value = _Var21._M_extent_value - 1;
    pLVar18 = pLVar18 + 1;
    aVar22.val = 0;
    local_e0 = pLVar18;
    while( true ) {
      ppCVar2 = (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      if ((void *)(((long)(pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x3333333333333333 +
                  ((long)(pSVar1->
                         super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                         super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(pSVar1->
                         super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                         super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                  -0x3333333333333333 +
                  (((long)ppCVar2 -
                    (long)(pSVar1->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                  (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 0xc) <= (ulong)aVar22) {
        return Success;
      }
      local_f0 = 0x20;
      local_ec = 1;
      local_f8 = aVar22;
      SVInt::clearUnusedBits((SVInt *)&local_f8);
      local_c0._0_8_ = local_f8;
      local_c0._8_4_ = local_f0;
      local_c0._12_1_ = (undefined1)local_ec;
      local_c0._13_1_ = local_ec._1_1_;
      if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
        local_f8.val = 0;
      }
      local_a0 = 1;
      local_c8 = local_90;
      std::operator=(&local_c8,&local_c0,&local_f9);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0);
      if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) && ((void *)local_f8.val != (void *)0x0))
      {
        operator_delete__(local_f8.pVal);
      }
      if (_Var21._M_extent_value < 2) {
        EVar9 = Statement::eval(this->body,local_d0);
      }
      else {
        cv_00 = std::
                _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                ::operator[]((_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                              *)local_e8._M_extent_value,aVar22.val);
        currDims_03._M_extent._M_extent_value = local_98._M_extent_value;
        currDims_03._M_ptr = local_e0;
        EVar9 = evalRecursive(this,local_d0,cv_00,currDims_03);
      }
      if ((EVar9 == Continue) || (EVar23 = EVar9, EVar9 == Success)) {
        EVar23 = (ER)pLVar18;
      }
      if ((EVar9 != Continue) && (EVar9 != Success)) break;
      aVar22.pVal = (uint64_t *)(aVar22.val + 1);
      pLVar18 = (pointer)(ulong)EVar23;
      this = local_d8;
    }
    return EVar23;
  default:
    local_88 = 0;
    local_78 = (pointer)0x0;
    pCVar20 = extraout_RDX;
  }
  if ((pLVar18->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_engaged == false) {
    uVar7 = (int)local_88 - 1;
    uVar15 = (ulong)uVar7;
    if ((int)uVar7 < 0) {
      return Success;
    }
    local_80 = (void *)(ulong)uVar7;
    local_e8._M_extent_value = 1;
    aVar22.val = 0;
    local_98._M_extent_value = 0;
  }
  else {
    CVar3 = (pLVar18->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value;
    uVar15 = (ulong)CVar3 >> 0x20;
    iVar17 = CVar3.left;
    iVar6 = CVar3.right;
    local_98._M_extent_value = CONCAT71((int7)((ulong)pCVar20 >> 8),iVar6 <= iVar17);
    if (iVar17 < iVar6) {
      local_e8._M_extent_value = 1;
      if (iVar6 < iVar17) {
        return Success;
      }
    }
    else {
      local_e8._M_extent_value = -1;
      if (iVar17 < iVar6) {
        return Success;
      }
    }
    local_80 = (void *)((long)CVar3 << 0x20 | uVar15);
    aVar22 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar17;
    this = local_d8;
  }
  local_68._M_extent_value = _Var21._M_extent_value - 1;
  local_70 = pLVar18 + 1;
  local_60 = (long)(int)uVar15;
  do {
    local_f0 = 0x20;
    local_ec = 1;
    local_f8 = aVar22;
    SVInt::clearUnusedBits((SVInt *)&local_f8);
    local_c0._0_8_ = local_f8;
    local_c0._8_4_ = local_f0;
    local_c0._12_1_ = (undefined1)local_ec;
    local_c0._13_1_ = local_ec._1_1_;
    if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
      local_f8.val = 0;
    }
    local_a0 = 1;
    local_c8 = local_90;
    std::operator=(&local_c8,&local_c0,&local_f9);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_c0);
    if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) && ((void *)local_f8.val != (void *)0x0)) {
      operator_delete__(local_f8.pVal);
    }
    if (_Var21._M_extent_value < 2) {
      EVar9 = Statement::eval(this->body,context);
    }
    else {
      aVar16 = aVar22;
      if ((local_e0->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
        local_c0._0_8_ = local_80;
        iVar8 = ConstantRange::translateIndex((ConstantRange *)&local_c0,(int32_t)aVar22.val);
        aVar16 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar8;
      }
      if (local_88 == 0) {
        local_a0 = 0;
      }
      else {
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0,
                          (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)(local_78 + aVar16.val));
      }
      currDims_00._M_extent._M_extent_value = local_68._M_extent_value;
      currDims_00._M_ptr = local_70;
      EVar9 = evalRecursive(this,context,(ConstantValue *)&local_c0,currDims_00);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0);
    }
    if ((EVar9 == Continue) || (EVar23 = EVar9, EVar9 == Success)) {
      EVar23 = (ER)pLVar18;
    }
    if ((EVar9 != Continue) && (EVar9 != Success)) {
      return EVar23;
    }
    aVar22.val = aVar22.val + local_e8._M_extent_value;
    bVar4 = (long)aVar22.val <= local_60;
    if ((char)local_98._M_extent_value != '\0') {
      bVar4 = local_60 <= (long)aVar22.val;
    }
    pLVar18 = (pointer)(ulong)EVar23;
    this = local_d8;
    context = local_d0;
  } while (bVar4);
  return Success;
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       std::span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        SLANG_ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        std::span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}